

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Minisat::Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::build
          (Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this,
          vec<int,_int> *ns)

{
  bool bVar1;
  Size SVar2;
  int *piVar3;
  int local_24;
  int local_20;
  int i_2;
  int i_1;
  int i;
  vec<int,_int> *ns_local;
  Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_> *this_local;
  
  i_2 = 0;
  while( true ) {
    SVar2 = vec<int,_int>::size(&this->heap);
    if (SVar2 <= i_2) break;
    piVar3 = vec<int,_int>::operator[](&this->heap,i_2);
    piVar3 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,*piVar3);
    *piVar3 = -1;
    i_2 = i_2 + 1;
  }
  vec<int,_int>::clear(&this->heap,false);
  local_20 = 0;
  while( true ) {
    SVar2 = vec<int,_int>::size(ns);
    if (SVar2 <= local_20) {
      SVar2 = vec<int,_int>::size(&this->heap);
      local_24 = SVar2 / 2;
      while (local_24 = local_24 + -1, -1 < local_24) {
        percolateDown(this,local_24);
      }
      return;
    }
    piVar3 = vec<int,_int>::operator[](ns,local_20);
    bVar1 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::has(&this->indices,*piVar3);
    if (!bVar1) break;
    piVar3 = vec<int,_int>::operator[](ns,local_20);
    piVar3 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,*piVar3);
    *piVar3 = local_20;
    piVar3 = vec<int,_int>::operator[](ns,local_20);
    vec<int,_int>::push(&this->heap,piVar3);
    local_20 = local_20 + 1;
  }
  __assert_fail("indices.has(ns[i])",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Heap.h"
                ,0x93,
                "void Minisat::Heap<int, Minisat::Solver::VarOrderLt>::build(const vec<K> &) [K = int, Comp = Minisat::Solver::VarOrderLt, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void build(const vec<K>& ns) {
        for (int i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear();

        for (int i = 0; i < ns.size(); i++){
            // TODO: this should probably call reserve instead of relying on it being reserved already.
            assert(indices.has(ns[i]));
            indices[ns[i]] = i;
            heap.push(ns[i]); }

        for (int i = heap.size() / 2 - 1; i >= 0; i--)
            percolateDown(i);
    }